

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asynclog.cpp
# Opt level: O3

void __thiscall AsyncLog::Append(AsyncLog *this,char *data,size_t writeSize)

{
  BufferPtr *__args;
  pointer __p;
  FixedBuffer<4096UL> *pFVar1;
  FixedBuffer<4096UL> *pFVar2;
  LockGuard lock;
  LockGuard LStack_28;
  
  LockGuard::LockGuard
            (&LStack_28,
             (this->m_mutex)._M_t.super___uniq_ptr_impl<Mutex,_std::default_delete<Mutex>_>._M_t.
             super__Tuple_impl<0UL,_Mutex_*,_std::default_delete<Mutex>_>.
             super__Head_base<0UL,_Mutex_*,_false>._M_head_impl);
  pFVar1 = (this->m_curBuff)._M_t.
           super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>.
           _M_t.
           super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
           .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl;
  if (writeSize < 0x1000 - pFVar1->m_pos) {
    memcpy(pFVar1->m_buff + pFVar1->m_pos,data,writeSize);
    pFVar1->m_pos = pFVar1->m_pos + writeSize;
  }
  else {
    __args = &this->m_curBuff;
    std::
    vector<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>,std::allocator<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>>
    ::emplace_back<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>
              ((vector<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>,std::allocator<std::unique_ptr<FixedBuffer<4096ul>,std::default_delete<FixedBuffer<4096ul>>>>>
                *)&this->m_buffers,__args);
    pFVar1 = (this->m_nextBuff)._M_t.
             super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>.
             _M_t.
             super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
             .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl;
    if (pFVar1 == (FixedBuffer<4096UL> *)0x0) {
      pFVar1 = (FixedBuffer<4096UL> *)operator_new(0x1008);
      pFVar1->m_pos = 0;
      pFVar2 = (__args->_M_t).
               super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
               .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl;
      (__args->_M_t).
      super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
      super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
      super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl = pFVar1;
    }
    else {
      (this->m_nextBuff)._M_t.
      super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
      super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
      super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl = (FixedBuffer<4096UL> *)0x0;
      pFVar2 = (this->m_curBuff)._M_t.
               super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
               .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl;
      (this->m_curBuff)._M_t.
      super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>._M_t.
      super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>.
      super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl = pFVar1;
    }
    if (pFVar2 != (FixedBuffer<4096UL> *)0x0) {
      operator_delete(pFVar2);
    }
    pFVar1 = (this->m_curBuff)._M_t.
             super___uniq_ptr_impl<FixedBuffer<4096UL>,_std::default_delete<FixedBuffer<4096UL>_>_>.
             _M_t.
             super__Tuple_impl<0UL,_FixedBuffer<4096UL>_*,_std::default_delete<FixedBuffer<4096UL>_>_>
             .super__Head_base<0UL,_FixedBuffer<4096UL>_*,_false>._M_head_impl;
    memcpy(pFVar1->m_buff + pFVar1->m_pos,data,writeSize);
    pFVar1->m_pos = pFVar1->m_pos + writeSize;
    Condition::Notify((this->m_subThreadFlushCond)._M_t.
                      super___uniq_ptr_impl<Condition,_std::default_delete<Condition>_>._M_t.
                      super__Tuple_impl<0UL,_Condition_*,_std::default_delete<Condition>_>.
                      super__Head_base<0UL,_Condition_*,_false>._M_head_impl);
  }
  LockGuard::~LockGuard(&LStack_28);
  return;
}

Assistant:

void AsyncLog::Append(const char * data, size_t writeSize)
{
	//std::cout << "Main thread, " << __LINE__ << std::endl;
	LockGuard lock(*m_mutex);
	if (m_curBuff->Avail() > writeSize)
	{
		//std::cout << __FILE__ << " " << __LINE__ << " " << __func__ << " m_curBuff->Avail()="  << m_curBuff->Avail() << " writeSize=" << writeSize << std::endl;
		m_curBuff->Append(data, writeSize);
	}
	else
	{
		m_buffers.push_back(std::move(m_curBuff));
		if (m_nextBuff)
		{
			m_curBuff = std::move(m_nextBuff);
		}
		else
		{
			m_curBuff.reset(new Buffer);
		}
		m_curBuff->Append(data, writeSize);
		m_subThreadFlushCond->Notify();
	}
	//std::cout << "Main thread, " << __LINE__ << std::endl;
}